

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.h
# Opt level: O2

size_t __thiscall libDAI::FactorGraph::findVar(FactorGraph *this,Var *n)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  _Var3;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[7])();
  uVar1 = *(undefined8 *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[7])(this);
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_equals_val<libDAI::Var_const>>
                    (uVar1,*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8),n);
  iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[7])(this);
  return (long)_Var3._M_current - *(long *)CONCAT44(extraout_var_01,iVar2) >> 4;
}

Assistant:

virtual size_t findVar( const Var & n ) const {
                size_t i = find( vars().begin(), vars().end(), n ) - vars().begin();
                assert( i != nrVars() );
                return i;
            }